

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O1

Sfm_Tim_t * Sfm_TimStart(Mio_Library_t *pLib,Scl_Con_t *pExt,Abc_Ntk_t *pNtk,int DeltaCrit)

{
  ulong uVar1;
  int iVar2;
  Sfm_Tim_t *p;
  int *piVar3;
  int iVar4;
  size_t sVar5;
  
  p = (Sfm_Tim_t *)calloc(1,0x70);
  p->pLib = pLib;
  p->pExt = pExt;
  p->pNtk = pNtk;
  iVar2 = pNtk->vObjs->nSize;
  uVar1 = (long)iVar2 * 3;
  iVar4 = (int)uVar1;
  if ((p->vTimArrs).nCap < iVar4) {
    piVar3 = (p->vTimArrs).pArray;
    sVar5 = (long)iVar2 * 0xc;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc(sVar5);
    }
    else {
      piVar3 = (int *)realloc(piVar3,sVar5);
    }
    (p->vTimArrs).pArray = piVar3;
    if (piVar3 == (int *)0x0) goto LAB_004dd7f1;
    (p->vTimArrs).nCap = iVar4;
  }
  if (0 < iVar2) {
    memset((p->vTimArrs).pArray,0,(uVar1 & 0xffffffff) << 2);
  }
  (p->vTimArrs).nSize = iVar4;
  iVar2 = pNtk->vObjs->nSize;
  uVar1 = (long)iVar2 * 3;
  iVar4 = (int)uVar1;
  if ((p->vTimReqs).nCap < iVar4) {
    piVar3 = (p->vTimReqs).pArray;
    sVar5 = (long)iVar2 * 0xc;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc(sVar5);
    }
    else {
      piVar3 = (int *)realloc(piVar3,sVar5);
    }
    (p->vTimReqs).pArray = piVar3;
    if (piVar3 == (int *)0x0) {
LAB_004dd7f1:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vTimReqs).nCap = iVar4;
  }
  if (0 < iVar2) {
    memset((p->vTimReqs).pArray,0,(uVar1 & 0xffffffff) << 2);
  }
  (p->vTimReqs).nSize = iVar4;
  iVar2 = Sfm_TimTrace(p);
  p->Delay = iVar2;
  if (DeltaCrit - 1U < 999999) {
    p->DeltaCrit = DeltaCrit;
    return p;
  }
  __assert_fail("DeltaCrit > 0 && DeltaCrit < Scl_Flt2Int(1000.0)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmTim.c"
                ,0xee,"Sfm_Tim_t *Sfm_TimStart(Mio_Library_t *, Scl_Con_t *, Abc_Ntk_t *, int)");
}

Assistant:

Sfm_Tim_t * Sfm_TimStart( Mio_Library_t * pLib, Scl_Con_t * pExt, Abc_Ntk_t * pNtk, int DeltaCrit )
{
    Sfm_Tim_t * p = ABC_CALLOC( Sfm_Tim_t, 1 );
    p->pLib = pLib;
    p->pExt = pExt;
    p->pNtk = pNtk;
    Vec_IntFill( &p->vTimArrs,  3*Abc_NtkObjNumMax(pNtk), 0 );
    Vec_IntFill( &p->vTimReqs,  3*Abc_NtkObjNumMax(pNtk), 0 );
    p->Delay = Sfm_TimTrace( p );
    assert( DeltaCrit > 0 && DeltaCrit < Scl_Flt2Int(1000.0) );
    p->DeltaCrit = DeltaCrit;
    return p;
}